

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O1

void mxx::stable_distribute_inplace<std::pair<int,int>>
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *param_1,
               comm *comm)

{
  pointer ppVar1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_28;
  
  impl::
  distribute_container<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  stable_distribute(&local_28,param_1,comm);
  ppVar1 = (param_1->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  (param_1->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_28.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (param_1->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_28.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (param_1->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_28.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_28.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1);
  }
  if (local_28.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void stable_distribute_inplace(std::vector<T>& local_els, const mxx::comm& comm) {
    impl::distribute_container<std::vector<T>>::stable_distribute_inplace(local_els, comm);
}